

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O3

void __thiscall FShaderManager::ApplyMatrices(FShaderManager *this,VSMatrix *proj,VSMatrix *view)

{
  FShader *pFVar1;
  FShaderManager *pFVar2;
  int i;
  long lVar3;
  ulong uVar4;
  
  if (gl.legacyMode) {
    (*_ptrc_glMatrixMode)(0x1701);
    (*_ptrc_glLoadMatrixf)(proj->mMatrix);
    (*_ptrc_glMatrixMode)(0x1700);
    (*_ptrc_glLoadMatrixf)(view->mMatrix);
    return;
  }
  lVar3 = 0;
  do {
    FShader::ApplyMatrices((this->mTextureEffects).Array[lVar3],proj,view);
    FShader::ApplyMatrices((this->mTextureEffectsNAT).Array[lVar3],proj,view);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  FShader::ApplyMatrices((this->mTextureEffects).Array[4],proj,view);
  if ((long)gl_fuzztype.Value != 0) {
    FShader::ApplyMatrices((this->mTextureEffects).Array[(long)gl_fuzztype.Value + 4],proj,view);
  }
  if (0xc < (this->mTextureEffects).Count) {
    uVar4 = 0xc;
    do {
      FShader::ApplyMatrices((this->mTextureEffects).Array[uVar4],proj,view);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->mTextureEffects).Count);
  }
  lVar3 = 0;
  do {
    FShader::ApplyMatrices(this->mEffectShaders[lVar3],proj,view);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pFVar1 = this->mActiveShader;
  if ((pFVar1 != (FShader *)0x0) &&
     (pFVar2 = GLRenderer->mShaderManager, pFVar2->mActiveShader != pFVar1)) {
    (*_ptrc_glUseProgram)(pFVar1->hShader);
    pFVar2->mActiveShader = pFVar1;
  }
  return;
}

Assistant:

void FShaderManager::ApplyMatrices(VSMatrix *proj, VSMatrix *view)
{
	if (gl.legacyMode)
	{
		glMatrixMode(GL_PROJECTION);
		glLoadMatrixf(proj->get());
		glMatrixMode(GL_MODELVIEW);
		glLoadMatrixf(view->get());
	}
	else
	{
		for (int i = 0; i < 4; i++)
		{
			mTextureEffects[i]->ApplyMatrices(proj, view);
			mTextureEffectsNAT[i]->ApplyMatrices(proj, view);
		}
		mTextureEffects[4]->ApplyMatrices(proj, view);
		if (gl_fuzztype != 0)
		{
			mTextureEffects[4 + gl_fuzztype]->ApplyMatrices(proj, view);
		}
		for (unsigned i = 12; i < mTextureEffects.Size(); i++)
		{
			mTextureEffects[i]->ApplyMatrices(proj, view);
		}
		for (int i = 0; i < MAX_EFFECTS; i++)
		{
			mEffectShaders[i]->ApplyMatrices(proj, view);
		}
		if (mActiveShader != NULL) mActiveShader->Bind();
	}
}